

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::ScriptContext::LoadScriptInternal
          (ScriptContext *this,Parser *parser,byte *script,size_t cb,SRCINFO *pSrcInfo,
          CompileScriptException *pse,Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,
          LoadScriptFlag loadScriptFlag,Var scriptSource)

{
  code *pcVar1;
  uint sourceIndex_00;
  byte *parser_00;
  bool bVar2;
  ULONG grfscr;
  BOOL BVar3;
  ParseNodeProg *parseTree_00;
  undefined4 *puVar4;
  ParseNodeProg *parseTree;
  JavascriptFunction *pFunction;
  CompileScriptException *pCStack_50;
  uint sourceIndex;
  CompileScriptException *pse_local;
  SRCINFO *pSrcInfo_local;
  size_t cb_local;
  byte *script_local;
  Parser *parser_local;
  ScriptContext *this_local;
  
  pFunction._4_4_ = 0xffffffff;
  parseTree = (ParseNodeProg *)0x0;
  pCStack_50 = pse;
  pse_local = (CompileScriptException *)pSrcInfo;
  pSrcInfo_local = (SRCINFO *)cb;
  cb_local = (size_t)script;
  script_local = (byte *)parser;
  parser_local = (Parser *)this;
  parseTree_00 = ParseScript(this,parser,script,cb,pSrcInfo,pse,ppSourceInfo,rootDisplayName,
                             loadScriptFlag,(uint *)((long)&pFunction + 4),scriptSource);
  parser_00 = script_local;
  sourceIndex_00 = pFunction._4_4_;
  if (parseTree_00 != (ParseNodeProg *)0x0) {
    grfscr = Utf8SourceInfo::GetParseFlags(*ppSourceInfo);
    parseTree = (ParseNodeProg *)
                GenerateRootFunction
                          (this,parseTree_00,sourceIndex_00,(Parser *)parser_00,grfscr,pCStack_50,
                           rootDisplayName);
  }
  if ((pCStack_50->super_ScriptException).ei.scode == -0x7ff5ebe4) {
    if ((loadScriptFlag & LoadScriptFlag_disableAsmJs) == LoadScriptFlag_disableAsmJs) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xa04,
                                  "((loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs)"
                                  ,
                                  "(loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    CompileScriptException::Free(pCStack_50);
    if (pFunction._4_4_ != 0xffffffff) {
      RemoveSource(this,pFunction._4_4_);
    }
    this_local = (ScriptContext *)
                 LoadScript(this,(byte *)cb_local,(size_t)pSrcInfo_local,(SRCINFO *)pse_local,
                            pCStack_50,ppSourceInfo,rootDisplayName,
                            loadScriptFlag | LoadScriptFlag_disableAsmJs,scriptSource);
  }
  else {
    BVar3 = IsProfiling(this);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xa17,"(!this->IsProfiling())","!this->IsProfiling()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = (ScriptContext *)parseTree;
  }
  return (JavascriptFunction *)this_local;
}

Assistant:

JavascriptFunction* ScriptContext::LoadScriptInternal(Parser* parser, const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, Js::Var scriptSource)
    {
        uint sourceIndex = Constants::InvalidSourceIndex;
        JavascriptFunction * pFunction = nullptr;

        ParseNodeProg * parseTree = ParseScript(parser, script, cb, pSrcInfo,
            pse, ppSourceInfo, rootDisplayName, loadScriptFlag,
            &sourceIndex, scriptSource);

        if (parseTree != nullptr)
        {
            pFunction = GenerateRootFunction(parseTree, sourceIndex, parser, (*ppSourceInfo)->GetParseFlags(), pse, rootDisplayName);
        }

        if (pse->ei.scode == JSERR_AsmJsCompileError)
        {
            Assert((loadScriptFlag & LoadScriptFlag_disableAsmJs) != LoadScriptFlag_disableAsmJs);

            pse->Free();
            if (sourceIndex != Constants::InvalidSourceIndex)
            {
                // If we registered source, we should remove it or we will register another source info
                this->RemoveSource(sourceIndex);
            }
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_disableAsmJs);
            return LoadScript(script, cb, pSrcInfo, pse, ppSourceInfo,
                rootDisplayName, loadScriptFlag, scriptSource);
        }

#ifdef ENABLE_SCRIPT_PROFILING
        if (pFunction != nullptr && this->IsProfiling())
        {
            RegisterScript(pFunction->GetFunctionProxy());
        }
#else
        Assert(!this->IsProfiling());
#endif

        return pFunction;
    }